

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * chaiscript::json::JSONParser::parse_object
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  const_reference pvVar1;
  JSON *this;
  runtime_error *prVar2;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  JSON Value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  JSON Key;
  
  JSON::Internal::make_type_abi_cxx11_((Data *)__return_storage_ptr__,(Internal *)0x1,(Class)offset)
  ;
  *offset = *offset + 1;
  consume_ws(str,offset);
  pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,*offset);
  if (*pvVar1 == '}') {
    *offset = *offset + 1;
  }
  else {
    while (*offset < str->_M_string_length) {
      parse_next(&Key,str,offset);
      consume_ws(str,offset);
      pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,*offset);
      if (*pvVar1 != ':') {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"JSON ERROR: Object: Expected colon, found \'",
                   (allocator<char> *)&local_78);
        pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           (str,*offset);
        std::operator+(&local_e0,&local_c0,*pvVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Value,
                       &local_e0,"\'\n");
        std::runtime_error::runtime_error(prVar2,(string *)&Value);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *offset = *offset + 1;
      consume_ws(str,offset);
      parse_next(&Value,str,offset);
      JSON::to_string_abi_cxx11_(&local_e0,&Key);
      this = JSON::operator[](__return_storage_ptr__,&local_e0);
      std::__detail::__variant::
      _Copy_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      ::operator=((_Copy_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                   *)this,(_Copy_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                           *)&Value);
      std::__cxx11::string::~string((string *)&local_e0);
      consume_ws(str,offset);
      pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,*offset);
      if (*pvVar1 != ',') {
        pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           (str,*offset);
        if (*pvVar1 == '}') {
          *offset = *offset + 1;
          std::__detail::__variant::
          _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
          ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                               *)&Value);
          std::__detail::__variant::
          _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
          ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                               *)&Key);
          return __return_storage_ptr__;
        }
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"JSON ERROR: Object: Expected comma, found \'",&local_e1);
        pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           (str,*offset);
        std::operator+(&local_c0,&local_78,*pvVar1);
        std::operator+(&local_e0,&local_c0,"\'\n");
        std::runtime_error::runtime_error(prVar2,(string *)&local_e0);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *offset = *offset + 1;
      std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                           *)&Value);
      std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                           *)&Key);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_object(const std::string &str, size_t &offset) {
      JSON Object(JSON::Class::Object);

      ++offset;
      consume_ws(str, offset);
      if (str.at(offset) == '}') {
        ++offset;
        return Object;
      }

      for (; offset < str.size();) {
        JSON Key = parse_next(str, offset);
        consume_ws(str, offset);
        if (str.at(offset) != ':') {
          throw std::runtime_error(std::string("JSON ERROR: Object: Expected colon, found '") + str.at(offset) + "'\n");
        }
        consume_ws(str, ++offset);
        JSON Value = parse_next(str, offset);
        Object[Key.to_string()] = Value;

        consume_ws(str, offset);
        if (str.at(offset) == ',') {
          ++offset;
          continue;
        } else if (str.at(offset) == '}') {
          ++offset;
          break;
        } else {
          throw std::runtime_error(std::string("JSON ERROR: Object: Expected comma, found '") + str.at(offset) + "'\n");
        }
      }

      return Object;
    }